

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_variable.cpp
# Opt level: O2

adios2_error adios2_set_block_selection(adios2_variable *variable,size_t block_id)

{
  allocator local_58 [32];
  string local_38;
  
  std::__cxx11::string::string
            ((string *)&local_38,"for adios2_variable, in call to adios2_set_block_selection",
             local_58);
  adios2::helper::CheckForNullptr<adios2_variable>(variable,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  adios2::core::VariableBase::SetBlockSelection((ulong)variable);
  return adios2_error_none;
}

Assistant:

adios2_error adios2_set_block_selection(adios2_variable *variable, const size_t block_id)
{
    try
    {
        adios2::helper::CheckForNullptr(variable, "for adios2_variable, in call to "
                                                  "adios2_set_block_selection");

        adios2::core::VariableBase *variableBase =
            reinterpret_cast<adios2::core::VariableBase *>(variable);
        variableBase->SetBlockSelection(block_id);
        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(
            adios2::helper::ExceptionToError("adios2_set_block_selection"));
    }
}